

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=
          (optional<tinyusdz::value::StringData> *this,optional<tinyusdz::value::StringData> *other)

{
  long *plVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      plVar1 = (long *)((long)&this->contained + 0x10);
      if (*(long **)&this->contained != plVar1) {
        operator_delete(*(long **)&this->contained,*plVar1 + 1);
      }
      this->has_value_ = false;
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      initialize<tinyusdz::value::StringData>(this,(StringData *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    std::__cxx11::string::operator=((string *)&this->contained,(string *)&other->contained);
    *(undefined8 *)((long)&this->contained + 0x20) = *(undefined8 *)((long)&other->contained + 0x20)
    ;
    *(undefined4 *)((long)&this->contained + 0x28) = *(undefined4 *)((long)&other->contained + 0x28)
    ;
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }